

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O2

void mon_break_armor(level *lev,monst *mon,boolean polyspot)

{
  byte bVar1;
  char cVar2;
  short sVar3;
  permonst *ptr;
  char *pcVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  obj *poVar9;
  permonst *ppVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  char buf [256];
  
  ptr = mon->data;
  if ((ptr->mflags1 & 0x2000) == 0) {
    bVar15 = ptr->msize != '\0';
  }
  else {
    bVar15 = false;
  }
  bVar1 = viz_array[mon->my][mon->mx];
  iVar6 = pronoun_gender(lev,mon);
  pcVar11 = genders[iVar6].him;
  iVar6 = pronoun_gender(lev,mon);
  pcVar4 = genders[iVar6].his;
  bVar5 = breakarm(ptr);
  if (bVar5 == '\0') {
    bVar5 = sliparm(ptr);
    if (bVar5 != '\0') {
      poVar9 = which_armor(mon,1);
      if (poVar9 != (obj *)0x0) {
        if ((bVar1 & 2) == 0) {
          You_hear("a thud.");
        }
        else {
          pcVar12 = Monnam(mon);
          pcVar12 = s_suffix(pcVar12);
          pline("%s armor falls around %s!",pcVar12,pcVar11);
        }
        if (polyspot != '\0') {
          poVar9->field_0x4d = poVar9->field_0x4d | 4;
          flags.bypasses = '\x01';
        }
        m_lose_armor(mon,poVar9);
      }
      poVar9 = which_armor(mon,2);
      if (poVar9 != (obj *)0x0) {
        if ((bVar1 & 2) != 0) {
          ppVar10 = mon->data;
          cVar2 = ppVar10->mlet;
          pcVar11 = Monnam(mon);
          if (ppVar10 == mons + 0x9f || cVar2 == '\x16') {
            pcVar11 = s_suffix(pcVar11);
            pcVar12 = cloak_simple_name(poVar9);
            pline("%s %s falls, unsupported!",pcVar11,pcVar12);
          }
          else {
            pcVar12 = cloak_simple_name(poVar9);
            pline("%s shrinks out of %s %s!",pcVar11,pcVar4,pcVar12);
          }
        }
        if (polyspot != '\0') {
          poVar9->field_0x4d = poVar9->field_0x4d | 4;
          flags.bypasses = '\x01';
        }
        m_lose_armor(mon,poVar9);
      }
      poVar9 = which_armor(mon,0x40);
      if (poVar9 != (obj *)0x0) {
        if ((bVar1 & 2) != 0) {
          bVar5 = sliparm(mon->data);
          pcVar11 = Monnam(mon);
          pcVar12 = "%s seeps right through %s shirt!";
          if (bVar5 == '\0') {
            pcVar12 = "%s becomes much too small for %s shirt!";
          }
          pline(pcVar12,pcVar11,pcVar4);
        }
        if (polyspot != '\0') {
          poVar9->field_0x4d = poVar9->field_0x4d | 4;
          flags.bypasses = '\x01';
        }
        m_lose_armor(mon,poVar9);
      }
    }
  }
  else {
    poVar9 = which_armor(mon,1);
    if (poVar9 != (obj *)0x0) {
      sVar3 = poVar9->otyp;
      if ((ushort)(sVar3 - 0x5fU) < 0xb) {
        ppVar10 = mons + (long)sVar3 + 0x34;
LAB_00277a6c:
        if (ptr != ppVar10) goto LAB_00277a71;
      }
      else {
        if ((ushort)(sVar3 - 0x54U) < 0xb) {
          ppVar10 = mons + (long)sVar3 + 0x3f;
          goto LAB_00277a6c;
        }
LAB_00277a71:
        if ((bVar1 & 2) == 0) {
          You_hear("a cracking sound.");
        }
        else {
          pcVar11 = Monnam(mon);
          pline("%s breaks out of %s armor!",pcVar11,pcVar4);
        }
      }
      m_useup(mon,poVar9);
    }
    poVar9 = which_armor(mon,2);
    if (poVar9 != (obj *)0x0) {
      if (poVar9->oartifact == '\0') {
        if ((bVar1 & 2) == 0) {
          You_hear("a ripping sound.");
        }
        else {
          pcVar11 = Monnam(mon);
          pcVar11 = s_suffix(pcVar11);
          pcVar12 = cloak_simple_name(poVar9);
          pline("%s %s tears apart!",pcVar11,pcVar12);
        }
        m_useup(mon,poVar9);
      }
      else {
        if ((bVar1 & 2) != 0) {
          pcVar11 = Monnam(mon);
          pcVar11 = s_suffix(pcVar11);
          pcVar12 = cloak_simple_name(poVar9);
          pline("%s %s falls off!",pcVar11,pcVar12);
        }
        if (polyspot != '\0') {
          poVar9->field_0x4d = poVar9->field_0x4d | 4;
          flags.bypasses = '\x01';
        }
        m_lose_armor(mon,poVar9);
      }
    }
    poVar9 = which_armor(mon,0x40);
    if (poVar9 != (obj *)0x0) {
      if ((bVar1 & 2) == 0) {
        You_hear("a ripping sound.");
      }
      else {
        pcVar11 = Monnam(mon);
        pcVar11 = s_suffix(pcVar11);
        pline("%s shirt rips to shreds!",pcVar11);
      }
      m_useup(mon,poVar9);
    }
  }
  if (bVar15) {
    iVar6 = num_horns(ptr);
    if (0 < iVar6) goto LAB_00277e82;
LAB_00277f4e:
    if (((ptr->mflags1 & 0x80000) != 0) || (ptr->mlet == '\x1d')) goto LAB_00277f60;
  }
  else {
    poVar9 = which_armor(mon,0x10);
    if (poVar9 != (obj *)0x0) {
      if ((bVar1 & 2) != 0) {
        pcVar11 = Monnam(mon);
        pcVar12 = " and weapon";
        if (mon->mw == (obj *)0x0) {
          pcVar12 = "";
        }
        pline("%s drops %s gloves%s!",pcVar11,pcVar4,pcVar12);
      }
      if (polyspot != '\0') {
        poVar9->field_0x4d = poVar9->field_0x4d | 4;
        flags.bypasses = '\x01';
      }
      m_lose_armor(mon,poVar9);
    }
    poVar9 = which_armor(mon,8);
    if (poVar9 != (obj *)0x0) {
      if ((bVar1 & 2) == 0) {
        You_hear("a clank.");
      }
      else {
        pcVar11 = Monnam(mon);
        pline("%s can no longer hold %s shield!",pcVar11,pcVar4);
      }
      if (polyspot != '\0') {
        poVar9->field_0x4d = poVar9->field_0x4d | 4;
        flags.bypasses = '\x01';
      }
      m_lose_armor(mon,poVar9);
    }
LAB_00277e82:
    poVar9 = which_armor(mon,4);
    if (poVar9 != (obj *)0x0) {
      if ((bVar15) &&
         (((long)poVar9->otyp == 0x3d ||
          ((*(ushort *)&objects[poVar9->otyp].field_0x11 & 0x180) == 0)))) goto LAB_00277f4e;
      if ((bVar1 & 2) == 0) {
        You_hear("a clank.");
      }
      else {
        pcVar11 = Monnam(mon);
        pcVar11 = s_suffix(pcVar11);
        pcVar12 = surface((int)mon->mx,(int)mon->my);
        pline("%s helmet falls to the %s!",pcVar11,pcVar12);
      }
      if (polyspot != '\0') {
        poVar9->field_0x4d = poVar9->field_0x4d | 4;
        flags.bypasses = '\x01';
      }
      m_lose_armor(mon,poVar9);
    }
    if (bVar15) goto LAB_00277f4e;
LAB_00277f60:
    poVar9 = which_armor(mon,0x20);
    if (poVar9 != (obj *)0x0) {
      if ((bVar1 & 2) != 0) {
        ppVar10 = mon->data;
        cVar2 = ppVar10->mlet;
        pcVar11 = Monnam(mon);
        pcVar11 = s_suffix(pcVar11);
        if (ppVar10 == mons + 0x9f || cVar2 == '\x16') {
          pline("%s boots fall away!",pcVar11);
        }
        else {
          pcVar12 = "are pushed";
          if (ptr->msize == '\0') {
            pcVar12 = "slide";
          }
          pline("%s boots %s off %s feet!",pcVar11,pcVar12,pcVar4);
        }
      }
      if (polyspot != '\0') {
        poVar9->field_0x4d = poVar9->field_0x4d | 4;
        flags.bypasses = '\x01';
      }
      m_lose_armor(mon,poVar9);
    }
  }
  bVar5 = can_saddle(mon);
  if (bVar5 == '\0') {
    poVar9 = which_armor(mon,0x100000);
    if (poVar9 != (obj *)0x0) {
      if (polyspot != '\0') {
        poVar9->field_0x4d = poVar9->field_0x4d | 4;
        flags.bypasses = '\x01';
      }
      m_lose_armor(mon,poVar9);
      if ((bVar1 & 2) != 0) {
        pcVar11 = Monnam(mon);
        pcVar11 = s_suffix(pcVar11);
        pline("%s saddle falls off.",pcVar11);
      }
    }
    if (u.usteed != mon) {
      return;
    }
  }
  else {
    if (u.usteed != mon) {
      return;
    }
    bVar5 = can_ride(mon);
    if (bVar5 != '\0') {
      return;
    }
  }
  pcVar11 = mon_nam(mon);
  pline("You can no longer ride %s.",pcVar11);
  if (((((u.usteed)->data == mons + 0xc) || ((u.usteed)->data == mons + 0xb)) &&
      (u.uprops[8].extrinsic == 0)) && (((byte)youmonst.mintrinsics & 0x80) == 0)) {
    uVar7 = mt_random();
    uVar7 = uVar7 % 3;
    lVar14 = (long)u.uluck;
    lVar13 = (long)u.moreluck;
    if (((int)(lVar13 + lVar14) != 0) &&
       (uVar8 = mt_random(), SUB168(ZEXT416(uVar8) % SEXT816(0x32 - (lVar13 + lVar14)),0) != 0)) {
      uVar8 = (int)u.moreluck + (int)u.uluck;
      if (-6 < (int)uVar8) {
        uVar8 = (uint)(short)((int)((uint)(ushort)((short)uVar8 >> 0xf) << 0x10 | uVar8 & 0xffff) /
                             3);
      }
      uVar7 = uVar7 - uVar8;
      if ((int)uVar7 < 0) goto LAB_002781ec;
      if (1 < uVar7) {
        uVar7 = 2;
      }
    }
    if (uVar7 != 0) {
      pcVar11 = mon_nam(u.usteed);
      pline("You touch %s.",pcVar11);
      pcVar11 = mons_mname((u.usteed)->data);
      pcVar11 = an(pcVar11);
      sprintf(buf,"falling off %s",pcVar11);
      delayed_petrify((char *)0x0,buf);
    }
  }
LAB_002781ec:
  dismount_steed(1);
  return;
}

Assistant:

void mon_break_armor(struct level *lev, struct monst *mon, boolean polyspot)
{
	struct obj *otmp;
	const struct permonst *mdat = mon->data;
	boolean vis = cansee(mon->mx, mon->my);
	boolean handless_or_tiny = (nohands(mdat) || verysmall(mdat));
	const char *pronoun = mhim(lev, mon),
		   *ppronoun = mhis(lev, mon);

	if (breakarm(mdat)) {
	    if ((otmp = which_armor(mon, W_ARM)) != 0) {
		if ((Is_dragon_scales(otmp->otyp) &&
			mdat == Dragon_scales_to_pm(otmp)) ||
		    (Is_dragon_mail(otmp->otyp) && mdat == Dragon_mail_to_pm(otmp)))
		    ;	/* no message here;
			   "the dragon merges with his scaly armor" is odd
			   and the monster's previous form is already gone */
		else if (vis)
		    pline("%s breaks out of %s armor!", Monnam(mon), ppronoun);
		else
		    You_hear("a cracking sound.");
		m_useup(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMC)) != 0) {
		if (otmp->oartifact) {
		    if (vis)
			pline("%s %s falls off!", s_suffix(Monnam(mon)),
				cloak_simple_name(otmp));
		    if (polyspot) bypass_obj(otmp);
		    m_lose_armor(mon, otmp);
		} else {
		    if (vis)
			pline("%s %s tears apart!", s_suffix(Monnam(mon)),
				cloak_simple_name(otmp));
		    else
			You_hear("a ripping sound.");
		    m_useup(mon, otmp);
		}
	    }
	    if ((otmp = which_armor(mon, W_ARMU)) != 0) {
		if (vis)
		    pline("%s shirt rips to shreds!", s_suffix(Monnam(mon)));
		else
		    You_hear("a ripping sound.");
		m_useup(mon, otmp);
	    }
	} else if (sliparm(mdat)) {
	    if ((otmp = which_armor(mon, W_ARM)) != 0) {
		if (vis)
		    pline("%s armor falls around %s!",
				 s_suffix(Monnam(mon)), pronoun);
		else
		    You_hear("a thud.");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMC)) != 0) {
		if (vis) {
		    if (is_whirly(mon->data))
			pline("%s %s falls, unsupported!",
				     s_suffix(Monnam(mon)), cloak_simple_name(otmp));
		    else
			pline("%s shrinks out of %s %s!", Monnam(mon),
						ppronoun, cloak_simple_name(otmp));
		}
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMU)) != 0) {
		if (vis) {
		    if (sliparm(mon->data))
			pline("%s seeps right through %s shirt!",
					Monnam(mon), ppronoun);
		    else
			pline("%s becomes much too small for %s shirt!",
					Monnam(mon), ppronoun);
		}
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (handless_or_tiny) {
	    /* [caller needs to handle weapon checks] */
	    if ((otmp = which_armor(mon, W_ARMG)) != 0) {
		if (vis)
		    pline("%s drops %s gloves%s!", Monnam(mon), ppronoun,
					MON_WEP(mon) ? " and weapon" : "");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMS)) != 0) {
		if (vis)
		    pline("%s can no longer hold %s shield!", Monnam(mon),
								ppronoun);
		else
		    You_hear("a clank.");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (handless_or_tiny || has_horns(mdat)) {
	    if ((otmp = which_armor(mon, W_ARMH)) != 0 &&
		    /* flimsy test for horns matches polyself handling */
		    (handless_or_tiny || !is_flimsy(otmp))) {
		if (vis)
		    pline("%s helmet falls to the %s!",
			  s_suffix(Monnam(mon)), surface(mon->mx, mon->my));
		else
		    You_hear("a clank.");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (handless_or_tiny || slithy(mdat) || mdat->mlet == S_CENTAUR) {
	    if ((otmp = which_armor(mon, W_ARMF)) != 0) {
		if (vis) {
		    if (is_whirly(mon->data))
			pline("%s boots fall away!",
				       s_suffix(Monnam(mon)));
		    else pline("%s boots %s off %s feet!",
			s_suffix(Monnam(mon)),
			verysmall(mdat) ? "slide" : "are pushed", ppronoun);
		}
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (!can_saddle(mon)) {
	    if ((otmp = which_armor(mon, W_SADDLE)) != 0) {
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
		if (vis)
		    pline("%s saddle falls off.", s_suffix(Monnam(mon)));
	    }
	    if (mon == u.usteed)
		goto noride;
	} else if (mon == u.usteed && !can_ride(mon)) {
	noride:
	    pline("You can no longer ride %s.", mon_nam(mon));
	    if (touch_petrifies(u.usteed->data) &&
			!Stone_resistance && rnl(3)) {
		char buf[BUFSZ];

		pline("You touch %s.", mon_nam(u.usteed));
		sprintf(buf, "falling off %s",
				an(mons_mname(u.usteed->data)));
		delayed_petrify(NULL, buf);
	    }
	    dismount_steed(DISMOUNT_FELL);
	}
	return;
}